

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_Event.h
# Opt level: O2

int __thiscall
axl::sys::NameableEventBase<axl::sl::False>::close(NameableEventBase<axl::sl::False> *this,int __fd)

{
  int in_EAX;
  int extraout_EAX;
  EventImpl *this_00;
  
  this_00 = this->m_event;
  if (this_00 == (EventImpl *)0x0) {
    return in_EAX;
  }
  if (this_00 != (EventImpl *)&this->field_3) {
    if ((this->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length == 0)
    goto LAB_00119e55;
    io::psx::SharedMemory::unlink((char *)&this->m_name);
    this_00 = this->m_event;
  }
  psx::CondMutexPair::~CondMutexPair(&this_00->m_condMutexPair);
LAB_00119e55:
  io::psx::Mapping::close(&this->m_mapping,__fd);
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::clear(&this->m_name);
  this->m_event = (EventImpl *)0x0;
  return extraout_EAX;
}

Assistant:

void
	close() {
		if (!m_event)
			return;

		if (m_event == (EventImpl*)m_unnamedEventBuffer) {
			m_event->~EventImpl();
		} else if (!m_name.isEmpty()) {
			io::psx::SharedMemory::unlink(m_name);
			m_event->~EventImpl();
		}

		m_mapping.close();
		m_name.clear();
		m_event = NULL;
	}